

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::BlurEffect::BlurEffect(BlurEffect *this,QColor *c,Orientation o,QWidget *parent)

{
  QFlags<Qt::WindowType> local_2c;
  QWidget *local_28;
  QWidget *parent_local;
  QColor *pQStack_18;
  Orientation o_local;
  QColor *c_local;
  BlurEffect *this_local;
  
  local_28 = parent;
  parent_local._4_4_ = o;
  pQStack_18 = c;
  c_local = (QColor *)this;
  QFlags<Qt::WindowType>::QFlags(&local_2c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_2c.i);
  *(undefined ***)this = &PTR_metaObject_00247da0;
  *(undefined ***)&this->field_0x10 = &PTR__BlurEffect_00247f50;
  this->policy = BlurAlwaysOff;
  this->orientation = parent_local._4_4_;
  *(undefined8 *)&this->color = *(undefined8 *)pQStack_18;
  *(undefined8 *)((long)&(this->color).ct + 4) = *(undefined8 *)((long)&pQStack_18->ct + 4);
  this->pressure = 0;
  this->darkBlurWidth = 4;
  this->maxPressure = 20.0;
  return;
}

Assistant:

BlurEffect::BlurEffect( const QColor & c, Qt::Orientation o, QWidget * parent )
	:	QWidget( parent )
	,	policy( AbstractScrollArea::BlurAlwaysOff )
	,	orientation( o )
	,	color( c )
	,	pressure( 0 )
	,	darkBlurWidth( 4 )
	,	maxPressure( 20.0 )
{
}